

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::ValidationErrorCollector::RecordWarning
          (ValidationErrorCollector *this,string_view filename,string_view element_name,
          Message *descriptor,ErrorLocation location,string_view message)

{
  MultiFileErrorCollector *pMVar1;
  uint local_40;
  uint local_3c;
  int column;
  int line;
  Message *descriptor_local;
  ValidationErrorCollector *this_local;
  string_view element_name_local;
  string_view filename_local;
  
  element_name_local._M_len = (size_t)element_name._M_str;
  this_local = (ValidationErrorCollector *)element_name._M_len;
  element_name_local._M_str = (char *)filename._M_len;
  if (this->owner_->error_collector_ != (MultiFileErrorCollector *)0x0) {
    _column = descriptor;
    descriptor_local = (Message *)this;
    if (location == IMPORT) {
      SourceLocationTable::FindImport
                (&this->owner_->source_locations_,descriptor,element_name,(int *)&local_3c,
                 (int *)&local_40);
    }
    else {
      SourceLocationTable::Find
                (&this->owner_->source_locations_,descriptor,location,(int *)&local_3c,
                 (int *)&local_40);
    }
    pMVar1 = this->owner_->error_collector_;
    (*pMVar1->_vptr_MultiFileErrorCollector[3])
              (pMVar1,element_name_local._M_str,filename._M_str,(ulong)local_3c,(ulong)local_40,
               message._M_str,message._M_len,message._M_str);
  }
  return;
}

Assistant:

void SourceTreeDescriptorDatabase::ValidationErrorCollector::RecordWarning(
    absl::string_view filename, absl::string_view element_name,
    const Message* descriptor, ErrorLocation location,
    absl::string_view message) {
  if (owner_->error_collector_ == nullptr) return;

  int line, column;
  if (location == DescriptorPool::ErrorCollector::IMPORT) {
    owner_->source_locations_.FindImport(descriptor, element_name, &line,
                                         &column);
  } else {
    owner_->source_locations_.Find(descriptor, location, &line, &column);
  }
  owner_->error_collector_->RecordWarning(filename, line, column, message);
}